

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_die_deliv.c
# Opt level: O1

int dwarf_die_abbrev_global_offset
              (Dwarf_Die die,Dwarf_Off *abbrev_goffset,Dwarf_Unsigned *abbrev_count,
              Dwarf_Error *error)

{
  Dwarf_Abbrev_List_conflict pDVar1;
  Dwarf_Signed errval;
  Dwarf_Debug dbg;
  
  if (die == (Dwarf_Die)0x0) {
    errval = 0x34;
  }
  else {
    if (die->di_cu_context != (Dwarf_CU_Context_conflict)0x0) {
      dbg = die->di_cu_context->cc_dbg;
      if ((dbg == (Dwarf_Debug)0x0) || (dbg->de_magic != 0xebfdebfd)) {
        _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,
                            "DW_DLE_DBG_NULL: accesing a cu context, Dwarf_Debug either null or it containsa stale Dwarf_Debug pointer"
                           );
        return 1;
      }
      pDVar1 = die->di_abbrev_list;
      if (pDVar1 != (Dwarf_Abbrev_List_conflict)0x0) {
        *abbrev_goffset = pDVar1->abl_goffset;
        *abbrev_count = pDVar1->abl_abbrev_count;
        return 0;
      }
      errval = 0x6e;
      goto LAB_0019a79a;
    }
    errval = 0x68;
  }
  dbg = (Dwarf_Debug)0x0;
LAB_0019a79a:
  _dwarf_error(dbg,error,errval);
  return 1;
}

Assistant:

int
dwarf_die_abbrev_global_offset(Dwarf_Die die,
    Dwarf_Off       * abbrev_goffset,
    Dwarf_Unsigned  * abbrev_count,
    Dwarf_Error*      error)
{
    Dwarf_Abbrev_List dal = 0;
    Dwarf_Debug dbg = 0;

    CHECK_DIE(die, DW_DLV_ERROR);
    dbg = die->di_cu_context->cc_dbg;
    dal = die->di_abbrev_list;
    if (!dal) {
        _dwarf_error(dbg,error,DW_DLE_DWARF_ABBREV_NULL);
        return DW_DLV_ERROR;
    }
    *abbrev_goffset = dal->abl_goffset;
    *abbrev_count = dal->abl_abbrev_count;
    return DW_DLV_OK;
}